

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.hpp
# Opt level: O2

size_t __thiscall
mahi::util::detail::
ProtoEvent<void_(int,_int,_int,_int),_mahi::util::detail::CollectorDefault<void>_>::add_cb
          (ProtoEvent<void_(int,_int,_int,_int),_mahi::util::detail::CollectorDefault<void>_> *this,
          CbFunction *cb)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::make_shared<std::function<void(int,int,int,int)>,std::function<void(int,int,int,int)>const&>
            ((function<void_(int,_int,_int,_int)> *)&stack0xffffffffffffffe0);
  std::__cxx11::
  list<std::shared_ptr<std::function<void(int,int,int,int)>>,std::allocator<std::shared_ptr<std::function<void(int,int,int,int)>>>>
  ::emplace_back<std::shared_ptr<std::function<void(int,int,int,int)>>>
            ((list<std::shared_ptr<std::function<void(int,int,int,int)>>,std::allocator<std::shared_ptr<std::function<void(int,int,int,int)>>>>
              *)this,(shared_ptr<std::function<void_(int,_int,_int,_int)>_> *)
                     &stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return (size_t)(this->callback_list_).
                 super__List_base<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>,_std::allocator<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

size_t add_cb(const CbFunction &cb)
    {
        callback_list_.emplace_back(std::make_shared<CbFunction>(cb));
        return size_t(callback_list_.back().get());
    }